

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.hpp
# Opt level: O1

back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_> __thiscall
pstore::diff_details::
traverser<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
::
visit_intermediate<pstore::index::details::internal_node,std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
          (traverser<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
           *this,index_pointer node,uint shifts,
          back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_> out)

{
  uint uVar1;
  long lVar2;
  pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
  local_48;
  
  pstore::index::details::internal_node::get_node(&local_48,*(database **)this,node);
  if (local_48.second != (internal_node *)0x0) {
    uVar1 = pstore::index::details::internal_node::size(local_48.second);
    if (uVar1 != 0) {
      lVar2 = 0;
      do {
        if ((((ulong)node.internal_ & 2) != 0) ||
           (*(ulong *)(this + 0x10) <= ((ulong)node.internal_ & 0xfffffffffffffffe))) {
          out = visit_node<std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
                          (this,*(index_pointer *)((long)(local_48.second)->children_ + lVar2),
                           shifts + 6,out);
        }
        lVar2 = lVar2 + 8;
      } while ((ulong)uVar1 << 3 != lVar2);
    }
    if (local_48.first.
        super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.first.
                 super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    return (back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>)
           out.container;
  }
  assert_failed("std::get<Node const *> (p) != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/diff.hpp"
                ,0x7d);
}

Assistant:

OutputIterator
        traverser<Index>::visit_intermediate (index::details::index_pointer const node,
                                              unsigned const shifts, OutputIterator out) const {
            std::pair<std::shared_ptr<void const>, Node const *> const p =
                Node::get_node (db_, node);
            PSTORE_ASSERT (std::get<Node const *> (p) != nullptr);
            for (auto child : *std::get<Node const *> (p)) {
                if (this->is_new (node)) {
                    out = this->visit_node (index_pointer{child},
                                            shifts + index::details::hash_index_bits, out);
                }
            }
            return out;
        }